

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeNVE::initialize(FluctuatingChargeNVE *this)

{
  double dVar1;
  Globals *pGVar2;
  pair<double,_double> local_18;
  
  FluctuatingChargePropagator::initialize(&this->super_FluctuatingChargePropagator);
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    pGVar2 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    if ((pGVar2->Dt).super_ParameterBase.empty_ == false) {
      dVar1 = (pGVar2->Dt).data_;
      this->dt_ = dVar1;
      this->dt2_ = dVar1 * 0.5;
    }
    else {
      builtin_strncpy(painCave.errMsg + 0x20,"s not set\n",0xb);
      builtin_strncpy(painCave.errMsg + 0x10,"eNVE Error: dt i",0x10);
      builtin_strncpy(painCave.errMsg,"FluctuatingCharg",0x10);
      painCave.isFatal = 1;
      simError();
      pGVar2 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    }
    if ((pGVar2->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b == '\0') {
      local_18.first = 0.0;
      local_18.second = 0.0;
      Snapshot::setElectronicThermostat(this->snap,&local_18);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeNVE Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!info_->getSimParams()->getUseIntialExtendedSystemState()) {
        snap->setElectronicThermostat(make_pair(0.0, 0.0));
      }
    }
  }